

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.cpp
# Opt level: O0

void __thiscall indigox::algorithm::AStarOptimisation::Initalise(AStarOptimisation *this)

{
  bool bVar1;
  size_t sVar2;
  undefined8 *puVar3;
  long in_RDI;
  ElectronOptimisationAlgorithm *in_stack_00000008;
  AStarOptimisation *in_stack_00000030;
  p_AStarQueueItem *in_stack_00000058;
  AStarOptimisation *in_stack_00000060;
  p_AStarQueueItem init;
  _List_iterator<void_*> v;
  size_t count;
  ElnVertIterPair vs;
  AStarQueueItem *__p;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff00;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff08;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff10;
  size_type in_stack_ffffffffffffff18;
  value_type *__x;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff20;
  priority_queue<std::shared_ptr<indigox::algorithm::AStarQueueItem>,_std::vector<std::shared_ptr<indigox::algorithm::AStarQueueItem>,_std::allocator<std::shared_ptr<indigox::algorithm::AStarQueueItem>_>_>,_indigox::algorithm::ItemCompare>
  *this_00;
  size_type in_stack_ffffffffffffff28;
  vector<void_*,_std::allocator<void_*>_> *in_stack_ffffffffffffff30;
  AStarOptimisation *in_stack_ffffffffffffff60;
  shared_ptr<indigox::algorithm::AStarQueueItem> local_90;
  undefined1 local_80 [16];
  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
  *in_stack_ffffffffffffff90;
  _Self local_60;
  pointer local_58;
  _List_iterator<void_*> local_50;
  _Self local_48 [9];
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13c768);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *)0x13c779);
  std::
  map<std::pair<void_*,_void_*>,_void_*,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>_>
  ::clear((map<std::pair<void_*,_void_*>,_void_*,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>_>
           *)0x13c78a);
  std::
  vector<std::pair<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_int>,_std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_int>_>_>
  ::clear((vector<std::pair<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_int>,_std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_int>_>_>
           *)0x13c798);
  std::
  map<void_*,_indigox::ElnVertProp_*,_std::less<void_*>,_std::allocator<std::pair<void_*const,_indigox::ElnVertProp_*>_>_>
  ::clear((map<void_*,_indigox::ElnVertProp_*,_std::less<void_*>,_std::allocator<std::pair<void_*const,_indigox::ElnVertProp_*>_>_>
           *)0x13c7a9);
  std::vector<void_*,_std::allocator<void_*>_>::clear
            ((vector<void_*,_std::allocator<void_*>_> *)0x13c7ba);
  std::
  map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::clear((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
           *)0x13c7cb);
  PriorityQueue::clear((PriorityQueue *)0x13c7dc);
  std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x13c7ee);
  utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
  ResetIndicies(in_stack_ffffffffffffff90);
  std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x13c808);
  sVar2 = utils::
          Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>::
          NumVertices((Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
                       *)0x13c810);
  *(size_t *)(in_RDI + 0x180) = sVar2;
  std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>::size
            ((vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_> *)
             (*(long *)(in_RDI + 8) + 8));
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x13c843);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             (unsigned_long)in_stack_ffffffffffffff10,
             (allocator<unsigned_long> *)in_stack_ffffffffffffff08);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x13c885);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x13c892);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
            (in_stack_ffffffffffffff10);
  std::vector<void_*,_std::allocator<void_*>_>::reserve
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x13c8cd);
  _local_50 = utils::
              Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
              ::GetVertices((Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
                             *)0x13c8d5);
  local_58 = (pointer)0x0;
  local_60._M_node = local_50._M_node;
  while( true ) {
    bVar1 = std::operator!=(&stack0xffffffffffffffa0,local_48);
    if (!bVar1) break;
    std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)in_stack_ffffffffffffff00);
    std::vector<void_*,_std::allocator<void_*>_>::push_back
              ((vector<void_*,_std::allocator<void_*>_> *)in_stack_ffffffffffffff10,
               (value_type *)in_stack_ffffffffffffff08);
    std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)in_stack_ffffffffffffff00);
    std::
    map<void*,unsigned_long,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>::
    emplace<void*&,unsigned_long&>
              ((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                *)in_stack_ffffffffffffff10,(void **)in_stack_ffffffffffffff08,
               (unsigned_long *)in_stack_ffffffffffffff00);
    local_58 = (pointer)((long)local_58 + 1);
    std::_List_iterator<void_*>::operator++(&stack0xffffffffffffffa0);
  }
  PopulateUniqueIDs(in_stack_ffffffffffffff60);
  PopulateUnchangeables(in_stack_00000030);
  puVar3 = (undefined8 *)operator_new(0x90);
  __x = (value_type *)0x0;
  this_00 = (priority_queue<std::shared_ptr<indigox::algorithm::AStarQueueItem>,_std::vector<std::shared_ptr<indigox::algorithm::AStarQueueItem>,_std::allocator<std::shared_ptr<indigox::algorithm::AStarQueueItem>_>_>,_indigox::algorithm::ItemCompare>
             *)0x0;
  puVar3[0x10] = 0;
  puVar3[0x11] = 0;
  puVar3[0xe] = 0;
  puVar3[0xf] = 0;
  puVar3[0xc] = 0;
  puVar3[0xd] = 0;
  puVar3[10] = 0;
  puVar3[0xb] = 0;
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  *puVar3 = 0;
  puVar3[1] = 0;
  AStarQueueItem::AStarQueueItem((AStarQueueItem *)0x0);
  __p = (AStarQueueItem *)local_80;
  std::shared_ptr<indigox::algorithm::AStarQueueItem>::
  shared_ptr<indigox::algorithm::AStarQueueItem,void>
            ((shared_ptr<indigox::algorithm::AStarQueueItem> *)in_stack_ffffffffffffff00,__p);
  std::shared_ptr<indigox::algorithm::AStarQueueItem>::shared_ptr
            (&local_90,(shared_ptr<indigox::algorithm::AStarQueueItem> *)__p);
  PopulateInitialDistribution(in_stack_00000060,in_stack_00000058);
  std::shared_ptr<indigox::algorithm::AStarQueueItem>::~shared_ptr
            ((shared_ptr<indigox::algorithm::AStarQueueItem> *)0x13caa4);
  std::
  priority_queue<std::shared_ptr<indigox::algorithm::AStarQueueItem>,_std::vector<std::shared_ptr<indigox::algorithm::AStarQueueItem>,_std::allocator<std::shared_ptr<indigox::algorithm::AStarQueueItem>_>_>,_indigox::algorithm::ItemCompare>
  ::push(this_00,__x);
  ElectronOptimisationAlgorithm::CalculateUpperLimit(in_stack_00000008);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x13cada);
  std::shared_ptr<indigox::algorithm::AStarQueueItem>::~shared_ptr
            ((shared_ptr<indigox::algorithm::AStarQueueItem> *)0x13cae7);
  return;
}

Assistant:

void AStarOptimisation::Initalise() {
  uniqueIDs_.clear();
  requiredUnchangeables_.clear();
  idsToVertex_.clear();
  minDistributions_.clear();
  vertexProperties_.clear();
  pos2vert_.clear();
  vert2pos_.clear();
  queue_.clear();
  parent_->molGraph_->ResetIndicies();
  
  vertMaskSize_ = parent_->elnGraph_->NumVertices();
  
  previousDist_ = ElnDist(parent_->possibleLocations_.size());
  previousDist_.reset();
  pos2vert_.reserve(vertMaskSize_);
  ElnVertIterPair vs = parent_->elnGraph_->GetVertices();
  size_t count = 0;
  for (auto v = vs.first; v != vs.second; ++v) {
    pos2vert_.push_back(*v);
    vert2pos_.emplace(*v, count);
    ++count;
  }
  
  PopulateUniqueIDs();
  PopulateUnchangeables();
  p_AStarQueueItem init = p_AStarQueueItem(new AStarQueueItem());
  PopulateInitialDistribution(init);
  queue_.push(init);
  CalculateUpperLimit();
}